

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O2

void __thiscall dg::vr::Bucket::disconnect(Bucket *this)

{
  VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *this_00;
  Type TVar1;
  pointer prVar2;
  Bucket *pBVar3;
  uint uVar4;
  iterator __position;
  long lVar5;
  ulong uVar6;
  
  for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 4) {
    TVar1 = *(Type *)((long)&Relations::all + lVar5);
    uVar6 = (ulong)TVar1;
    if ((uVar6 == 0) &&
       (prVar2 = (this->relatedBuckets)._M_elems[0].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (this->relatedBuckets)._M_elems[0].vec.
       super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != prVar2)) {
      (this->relatedBuckets)._M_elems[0].vec.
      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = prVar2;
    }
    this_00 = (this->relatedBuckets)._M_elems + uVar6;
    for (__position._M_current =
              (this->relatedBuckets)._M_elems[uVar6].vec.
              super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current !=
        (this_00->vec).
        super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
        __position = std::
                     vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                     ::erase(&this_00->vec,(const_iterator)__position._M_current)) {
      pBVar3 = (__position._M_current)->_M_data;
      if (this->id != pBVar3->id) {
        uVar4 = dg::vr::Relations::inverted(TVar1);
        VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>
                  ((VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)
                   ((pBVar3->relatedBuckets)._M_elems + uVar4),this);
      }
    }
  }
  return;
}

Assistant:

void disconnect() {
        for (Relations::Type type : Relations::all) {
            if (type == Relations::EQ) {
                assert(relatedBuckets[type].size() == 1);
                relatedBuckets[type].clear();
            }
            for (auto it = relatedBuckets[type].begin();
                 it != relatedBuckets[type].end();
                 /*incremented by erase*/) {
                if (*this != *it)
                    it->get().relatedBuckets[Relations::inverted(type)].erase(
                            *this);
                it = relatedBuckets[type].erase(it);
            }
        }
        assert(!hasAnyRelation());
    }